

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCursorSeek(unqlite_kv_cursor *pCursor,void *pKey,int nByte,int iPos)

{
  lhash_kv_engine *pEngine;
  undefined4 uVar1;
  int iVar2;
  sxu32 nHash;
  lhpage *in_RAX;
  lhash_bmap_rec *plVar3;
  lhcell *plVar4;
  ulong uVar5;
  ulong iLogic;
  int in_R8D;
  lhpage *local_38;
  
  pEngine = (lhash_kv_engine *)pCursor->pStore;
  local_38 = in_RAX;
  iVar2 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,1,&pEngine->pHeader);
  if (iVar2 == 0) {
    nHash = (*pEngine->xHash)(pKey,nByte);
    uVar5 = (ulong)((int)pEngine->nmax_split_nucket - 1U & nHash);
    iLogic = (ulong)((int)pEngine->max_split_bucket - 1U & nHash);
    if (uVar5 < pEngine->split_bucket + pEngine->max_split_bucket) {
      iLogic = uVar5;
    }
    plVar3 = lhMapFindBucket(pEngine,iLogic);
    iVar2 = -6;
    if (((plVar3 != (lhash_bmap_rec *)0x0) &&
        (iVar2 = lhLoadPage(pEngine,plVar3->iReal,(lhpage *)0x0,&local_38,in_R8D), iVar2 == 0)) &&
       (plVar4 = lhFindCell(local_38,pKey,nByte,nHash), iVar2 = -6, plVar4 != (lhcell *)0x0)) {
      pCursor[2].pStore = (unqlite_kv_engine *)plVar4;
      iVar2 = 0;
      uVar1 = 2;
      goto LAB_001111c1;
    }
  }
  pCursor[2].pStore = (unqlite_kv_engine *)0x0;
  uVar1 = 3;
LAB_001111c1:
  *(undefined4 *)&pCursor[1].pStore = uVar1;
  return iVar2;
}

Assistant:

static int lhCursorSeek(unqlite_kv_cursor *pCursor,const void *pKey,int nByte,int iPos)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	int rc;
	/* Perform a lookup */
	rc = lhRecordLookup((lhash_kv_engine *)pCur->pStore,pKey,nByte,&pCur->pCell);
	if( rc != UNQLITE_OK ){
		SXUNUSED(iPos);
		pCur->pCell = 0;
		pCur->iState = L_HASH_CURSOR_STATE_DONE;
		return rc;
	}
	pCur->iState = L_HASH_CURSOR_STATE_CELL;
	return UNQLITE_OK;
}